

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

int __thiscall QComboBox::findData(QComboBox *this,QVariant *data,int role,MatchFlags flags)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  QComboBoxPrivate *pQVar4;
  QModelIndex *this_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  QComboBoxPrivate *d;
  QModelIndexList result;
  QModelIndex start;
  QList<QModelIndex> *in_stack_ffffffffffffff60;
  int local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QPersistentModelIndex local_40 [3];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ECX;
  pQVar4 = d_func((QComboBox *)0x537b8b);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = pQVar4->model;
  iVar1 = pQVar4->modelColumn;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_40);
  (**(code **)(*(long *)pQVar2 + 0x60))(&local_28,pQVar2,0,iVar1,local_40);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)pQVar4->model + 0x150))
            (&local_58,pQVar4->model,&local_28,in_EDX,in_RSI,1,local_c);
  bVar3 = QList<QModelIndex>::isEmpty((QList<QModelIndex> *)0x537c84);
  if (bVar3) {
    local_60 = -1;
  }
  else {
    this_00 = QList<QModelIndex>::first(in_stack_ffffffffffffff60);
    local_60 = QModelIndex::row(this_00);
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x537cc4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_60;
  }
  __stack_chk_fail();
}

Assistant:

int QComboBox::findData(const QVariant &data, int role, Qt::MatchFlags flags) const
{
    Q_D(const QComboBox);
    QModelIndex start = d->model->index(0, d->modelColumn, d->root);
    const QModelIndexList result = d->model->match(start, role, data, 1, flags);
    if (result.isEmpty())
        return -1;
    return result.first().row();
}